

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O1

void mbhit(monst *mon,int range,_func_int_monst_ptr_obj_ptr *fhitm,_func_int_obj_ptr_obj_ptr *fhito,
          obj *obj)

{
  obj *poVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  obj *poVar8;
  char *pcVar9;
  byte bVar10;
  int iVar11;
  monst *worm;
  char cVar12;
  ulong uVar13;
  int y;
  int x;
  int local_40;
  int local_3c;
  ulong local_38;
  
  bhitpos.x = mon->mx;
  bhitpos.y = mon->my;
  iVar4 = sgn((int)mon->mux - (int)bhitpos.x);
  uVar5 = sgn((int)mon->muy - (int)mon->my);
  uVar13 = (ulong)uVar5;
  local_38 = uVar13;
  do {
    if (range < 1) {
      return;
    }
    iVar6 = range + -1;
    cVar12 = bhitpos.x + (char)iVar4;
    bVar10 = bhitpos.y + (char)uVar13;
    local_3c = (int)cVar12;
    local_40 = (int)(char)bVar10;
    if (((byte)(cVar12 - 1U) < 0x4f) && (bVar10 < 0x15)) {
      bhitpos.x = cVar12;
      bhitpos.y = bVar10;
      bVar3 = find_drawbridge(&local_3c,&local_40);
      if ((bVar3 != '\0') &&
         ((*(short *)(fhitm + 0x2a) == 0x1c4 && (level->locations[bhitpos.x][bhitpos.y].typ == '\f')
          ))) {
        destroy_drawbridge(local_3c,local_40);
        if (mon->wormno == '\0') {
          if (((viz_array[mon->my][mon->mx] & 2U) != 0) ||
             (((((u.uprops[0x1e].intrinsic == 0 &&
                 (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
               ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
              (((viz_array[mon->my][mon->mx] & 1U) != 0 && ((mon->data->mflags3 & 0x200) != 0))))))
          goto LAB_001f86c4;
        }
        else {
          bVar3 = worm_known(level,mon);
          if (bVar3 != '\0') {
LAB_001f86c4:
            uVar5 = *(uint *)&mon->field_0x60;
            if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar5 & 0x280) == 0) goto LAB_001f8716;
            }
            else if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001f8716:
              if ((u._1052_1_ & 0x20) == 0) {
                discover_object((int)*(short *)(fhitm + 0x2a),'\x01','\x01');
              }
            }
          }
        }
      }
      if ((bhitpos.x == u.ux) && (worm = &youmonst, bhitpos.y == u.uy)) {
LAB_001f8a0f:
        mbhitm(worm,(obj *)fhitm);
        iVar6 = range + -4;
      }
      else {
        worm = level->monsters[bhitpos.x][bhitpos.y];
        if ((worm != (monst *)0x0) && ((worm->field_0x61 & 2) == 0)) {
          if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
            if (worm->wormno == '\0') {
              if (((viz_array[worm->my][worm->mx] & 2U) != 0) ||
                 ((((u.uprops[0x1e].intrinsic == 0 &&
                    (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                     (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                   ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                  (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                    (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                   (((viz_array[worm->my][worm->mx] & 1U) != 0 &&
                    ((worm->data->mflags3 & 0x200) != 0)))))))) goto LAB_001f8871;
            }
            else {
              bVar3 = worm_known(level,worm);
              if (bVar3 != '\0') {
LAB_001f8871:
                uVar5 = *(uint *)&worm->field_0x60;
                if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  if ((uVar5 & 0x280) == 0) goto LAB_001f88b3;
                }
                else if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001f88b3:
                  if ((u._1052_1_ & 0x20) == 0) goto LAB_001f8a0f;
                }
              }
            }
            if (((((worm->data->mflags1 & 0x10000) != 0) ||
                 ((poVar8 = which_armor(worm,4), poVar8 != (obj *)0x0 &&
                  (poVar8 = which_armor(worm,4), poVar8->otyp == 0x4f)))) ||
                ((((u.uprops[0x1e].intrinsic == 0 &&
                   (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                  (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
                   ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                     (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                     youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
                 (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
                  (iVar6 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), 0x40 < iVar6)))))
                ) && (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
                      (bVar3 = match_warn_of_mon(worm), bVar3 == '\0')))) {
              map_invisible(bhitpos.x,bhitpos.y);
            }
          }
          goto LAB_001f8a0f;
        }
      }
      poVar8 = level->objects[bhitpos.x][bhitpos.y];
      iVar11 = 0;
      if (poVar8 != (obj *)0x0) {
        do {
          poVar1 = (poVar8->v).v_nexthere;
          iVar7 = bhito(poVar8,(obj *)fhitm);
          iVar11 = iVar11 + iVar7;
          poVar8 = poVar1;
        } while (poVar1 != (obj *)0x0);
        iVar11 = -(uint)(iVar11 != 0);
      }
      bVar10 = level->locations[bhitpos.x][bhitpos.y].typ;
      if (((bVar10 == 0x17) || (bVar10 == 0xf)) &&
         ((*(ushort *)(fhitm + 0x2a) - 0x1c4 < 10 &&
          (((0x301U >> (*(ushort *)(fhitm + 0x2a) - 0x1c4 & 0x1f) & 1) != 0 &&
           (bVar3 = doorlock((obj *)fhitm,(int)bhitpos.x,(int)bhitpos.y), bVar3 != '\0')))))) {
        if (mon->wormno == '\0') {
          if (((viz_array[mon->my][mon->mx] & 2U) != 0) ||
             (((((u.uprops[0x1e].intrinsic == 0 &&
                 (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
               ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
              (((viz_array[mon->my][mon->mx] & 1U) != 0 && ((mon->data->mflags3 & 0x200) != 0))))))
          goto LAB_001f8bb1;
        }
        else {
          bVar3 = worm_known(level,mon);
          if (bVar3 != '\0') {
LAB_001f8bb1:
            uVar5 = *(uint *)&mon->field_0x60;
            if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar5 & 0x280) == 0) goto LAB_001f8c03;
            }
            else if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001f8c03:
              if ((u._1052_1_ & 0x20) == 0) {
                discover_object((int)*(short *)(fhitm + 0x2a),'\x01','\x01');
              }
            }
          }
        }
        if (((*(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 & 0x1f0) == 0x10) &&
           (pcVar9 = in_rooms(level,bhitpos.x,bhitpos.y,0x12), *pcVar9 != '\0')) {
          add_damage(bhitpos.x,bhitpos.y,0);
        }
      }
      range = iVar6 + iVar11;
      uVar13 = local_38;
      if ((bVar10 < 0x11) ||
         ((bVar2 = true, bVar10 == 0x17 &&
          ((level->locations[bhitpos.x][bhitpos.y].field_0x6 & 0xc0) != 0)))) {
        bhitpos.x = bhitpos.x - (char)iVar4;
        bhitpos.y = bhitpos.y - (char)local_38;
        iVar6 = range;
        goto LAB_001f8cc4;
      }
    }
    else {
LAB_001f8cc4:
      range = iVar6;
      bVar2 = false;
    }
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

static void mbhit(struct monst *mon,	/* monster shooting the wand */
		  int range,		/* direction and range */
		  int (*fhitm)(struct monst*,struct obj*),
		  int (*fhito)(struct obj*,struct obj*), /* fns called when mon/obj hit */
		  struct obj *obj)	/* 2nd arg to fhitm/fhito */
{
	struct monst *mtmp;
	struct obj *otmp;
	uchar typ;
	int ddx, ddy;

	bhitpos.x = mon->mx;
	bhitpos.y = mon->my;
	ddx = sgn(mon->mux - mon->mx);
	ddy = sgn(mon->muy - mon->my);

	while (range-- > 0) {
		int x,y;

		bhitpos.x += ddx;
		bhitpos.y += ddy;
		x = bhitpos.x; y = bhitpos.y;

		if (!isok(x,y)) {
		    bhitpos.x -= ddx;
		    bhitpos.y -= ddy;
		    break;
		}
		if (find_drawbridge(&x,&y)) {
		    switch (obj->otyp) {
			case WAN_STRIKING:
			    /* destroy closed drawbridges, not open ones */
			    if (level->locations[bhitpos.x][bhitpos.y].typ == DBWALL) {
				destroy_drawbridge(x,y);
				if (canseemon(level, mon))
				    makeknown(obj->otyp);
			    }
			    break;
		    }
		}
		if (bhitpos.x==u.ux && bhitpos.y==u.uy) {
			(*fhitm)(&youmonst, obj);
			range -= 3;
		} else if (MON_AT(level, bhitpos.x, bhitpos.y)){
			mtmp = m_at(level, bhitpos.x, bhitpos.y);
			if (cansee(bhitpos.x,bhitpos.y) && !canspotmon(level, mtmp))
			    map_invisible(bhitpos.x, bhitpos.y);
			(*fhitm)(mtmp, obj);
			range -= 3;
		}
		/* modified by GAN to hit all objects */
		if (fhito){
		    int hitanything = 0;
		    struct obj *next_obj;

		    for (otmp = level->objects[bhitpos.x][bhitpos.y];
							otmp; otmp = next_obj) {
			/* Fix for polymorph bug, Tim Wright */
			next_obj = otmp->nexthere;
			hitanything += (*fhito)(otmp, obj);
		    }
		    if (hitanything)	range--;
		}
		typ = level->locations[bhitpos.x][bhitpos.y].typ;
		if (IS_DOOR(typ) || typ == SDOOR) {
		    switch (obj->otyp) {
			/* note: monsters don't use opening or locking magic
			   at present, but keep these as placeholders */
			case WAN_OPENING:
			case WAN_LOCKING:
			case WAN_STRIKING:
			    if (doorlock(obj, bhitpos.x, bhitpos.y)) {
				if (canseemon(level, mon))
				    makeknown(obj->otyp);
				/* if a shop door gets broken, add it to
				   the shk's fix list (no cost to player) */
				if (level->locations[bhitpos.x][bhitpos.y].doormask ==
					D_BROKEN &&
				    *in_rooms(level, bhitpos.x, bhitpos.y, SHOPBASE))
				    add_damage(bhitpos.x, bhitpos.y, 0L);
			    }
			    break;
		    }
		}
		if (!ZAP_POS(typ) || (IS_DOOR(typ) &&
		   (level->locations[bhitpos.x][bhitpos.y].doormask & (D_LOCKED | D_CLOSED)))
		  ) {
			bhitpos.x -= ddx;
			bhitpos.y -= ddy;
			break;
		}
	}
}